

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O1

Lazy<cinatra::resp_data> __thiscall
cinatra::coro_http_client::
async_request<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
          (coro_http_client *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *uri,http_method method,
          req_context<std::basic_string_view<char,_std::char_traits<char>_>_> *ctx,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *headers,span<char,_18446744073709551615UL> out_buf)

{
  size_type *psVar1;
  char **ppcVar2;
  long *plVar3;
  undefined1 *puVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  size_t sVar8;
  char *pcVar9;
  element_type *peVar10;
  string_view *psVar11;
  undefined4 in_register_00000014;
  long *plVar12;
  
  plVar12 = (long *)CONCAT44(in_register_00000014,method);
  peVar10 = (element_type *)operator_new(0x358,(nothrow_t *)&std::nothrow);
  if (peVar10 == (element_type *)0x0) {
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    *(code **)&(peVar10->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
               super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> =
         async_request<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>;
    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(peVar10->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
            super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         async_request<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>;
    ((string_view *)((long)(peVar10->parser_).headers_._M_elems + 0x2d0))->_M_len =
         (size_t)out_buf._M_ptr;
    *(size_t *)((long)(peVar10->parser_).headers_._M_elems + 0x2d8) =
         out_buf._M_extent._M_extent_value;
    *(int *)((long)(peVar10->parser_).headers_._M_elems + 0x308) = (int)ctx;
    (((http_header *)((long)(peVar10->parser_).headers_._M_elems + 0x300))->name)._M_len =
         (size_t)uri;
    ppcVar2 = (char **)((long)(peVar10->parser_).headers_._M_elems + 0x208);
    *(char ***)((long)(peVar10->parser_).headers_._M_elems + 0x1f8) = ppcVar2;
    plVar3 = plVar12 + 2;
    if ((long *)*plVar12 == plVar3) {
      sVar8 = plVar12[3];
      *ppcVar2 = (char *)*plVar3;
      ((string_view *)((long)(peVar10->parser_).headers_._M_elems + 0x210))->_M_len = sVar8;
    }
    else {
      *(char **)((long)(peVar10->parser_).headers_._M_elems + 0x1f8) = (char *)*plVar12;
      *(char **)((long)(peVar10->parser_).headers_._M_elems + 0x208) = (char *)*plVar3;
    }
    (((http_header *)((long)(peVar10->parser_).headers_._M_elems + 0x200))->name)._M_len =
         plVar12[1];
    *plVar12 = (long)plVar3;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    *(undefined4 *)((long)(peVar10->parser_).headers_._M_elems + 0xd8) =
         *(undefined4 *)&(headers->_M_h)._M_buckets;
    psVar11 = (string_view *)((long)(peVar10->parser_).headers_._M_elems + 0xf0);
    (((http_header *)((long)(peVar10->parser_).headers_._M_elems + 0xe0))->name)._M_len =
         (size_t)psVar11;
    puVar4 = (undefined1 *)(headers->_M_h)._M_bucket_count;
    psVar1 = &(headers->_M_h)._M_element_count;
    if ((size_type *)puVar4 == psVar1) {
      pcVar9 = *(char **)&(headers->_M_h)._M_rehash_policy;
      psVar11->_M_len = *psVar1;
      *(char **)((long)(peVar10->parser_).headers_._M_elems + 0xf8) = pcVar9;
    }
    else {
      (((http_header *)((long)(peVar10->parser_).headers_._M_elems + 0xe0))->name)._M_len =
           (size_t)puVar4;
      ((string_view *)((long)(peVar10->parser_).headers_._M_elems + 0xf0))->_M_len = *psVar1;
    }
    *(_Hash_node_base **)((long)(peVar10->parser_).headers_._M_elems + 0xe8) =
         (headers->_M_h)._M_before_begin._M_nxt;
    (headers->_M_h)._M_bucket_count = (size_type)psVar1;
    (headers->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    *(undefined1 *)&(headers->_M_h)._M_element_count = 0;
    ((string_view *)((long)(peVar10->parser_).headers_._M_elems + 0x110))->_M_len =
         (size_t)headers[1]._M_h._M_buckets;
    uVar5 = *(undefined4 *)((long)&(headers->_M_h)._M_rehash_policy._M_next_resize + 4);
    uVar6 = *(undefined4 *)&(headers->_M_h)._M_single_bucket;
    uVar7 = *(undefined4 *)((long)&(headers->_M_h)._M_single_bucket + 4);
    *(int *)&(((http_header *)((long)(peVar10->parser_).headers_._M_elems + 0x100))->name)._M_len =
         (int)(headers->_M_h)._M_rehash_policy._M_next_resize;
    *(undefined4 *)((long)(peVar10->parser_).headers_._M_elems + 0x104) = uVar5;
    *(undefined4 *)((long)(peVar10->parser_).headers_._M_elems + 0x108) = uVar6;
    *(undefined4 *)((long)(peVar10->parser_).headers_._M_elems + 0x10c) = uVar7;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)((long)(peVar10->parser_).headers_._M_elems + 0x1c0));
    (peVar10->parser_).msg_._M_str = (char *)0x0;
    *(undefined8 *)&peVar10->parser_ = 0;
    (peVar10->parser_).msg_._M_len = 0;
    *(undefined1 *)((long)(peVar10->parser_).headers_._M_elems + 0x18) = 0;
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar10;
    *(undefined1 *)((long)(peVar10->parser_).headers_._M_elems + 0x30c) = 0;
  }
  return (LazyBase<cinatra::resp_data,_false>)(LazyBase<cinatra::resp_data,_false>)this;
}

Assistant:

async_simple::coro::Lazy<resp_data> async_request(
      S uri, http_method method, req_context<String> ctx,
      std::unordered_map<std::string, std::string> headers = {},
      std::span<char> out_buf = {}) {
    if (!resp_chunk_str_.empty()) {
      resp_chunk_str_.clear();
    }
    if (!body_.empty()) {
      body_.clear();
    }

    out_buf_ = out_buf;

    std::shared_ptr<int> guard(nullptr, [this](auto) {
      if (!req_headers_.empty()) {
        req_headers_.clear();
      }
    });

    resp_data data{};

    std::error_code ec{};
    size_t size = 0;
    bool is_keep_alive = true;

    do {
      uri_t u;
      std::string append_uri;

      if (socket_->has_closed_ || (!uri.empty() && uri[0] != '/')) {
        bool no_schema = !has_schema(uri);

        if (no_schema) {
#ifdef CINATRA_ENABLE_SSL
          if (is_ssl_schema_) {
            append_uri.append("https://").append(uri);
          }
          else
#endif
          {
            append_uri.append("http://").append(uri);
          }
        }
        bool ok = false;
        std::tie(ok, u) = handle_uri(data, no_schema ? append_uri : uri);
        if (!ok) {
          break;
        }
      }
      else {
        u.path = uri;
      }
      if (socket_->has_closed_) {
        data = co_await connect(u);
        if (data.status != 0) {
          co_return data;
        }
      }

      std::vector<asio::const_buffer> vec;
      std::string req_head_str =
          build_request_header(u, method, ctx, false, std::move(headers));

      bool has_body = !ctx.content.empty();
      if (has_body) {
        vec.push_back(asio::buffer(req_head_str));
        vec.push_back(asio::buffer(ctx.content.data(), ctx.content.size()));
      }

#ifdef CORO_HTTP_PRINT_REQ_HEAD
      CINATRA_LOG_DEBUG << req_head_str;
#endif
      auto guard = timer_guard(this, req_timeout_duration_, "request timer");
      if (has_body) {
        std::tie(ec, size) = co_await async_write(vec);
      }
      else {
        std::tie(ec, size) = co_await async_write(asio::buffer(req_head_str));
      }
      if (ec) {
        break;
      }
      data =
          co_await handle_read(ec, size, is_keep_alive, std::move(ctx), method);
    } while (0);
    if (ec && socket_->is_timeout_) {
      ec = std::make_error_code(std::errc::timed_out);
    }
    handle_result(data, ec, is_keep_alive);
    co_return data;
  }